

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float32_div_aarch64(float32 a,float32 b,float_status *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  uint uVar4;
  union_float32 ub;
  ulong uVar5;
  union_float32 ua;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  FloatParts FVar17;
  FloatParts FVar18;
  FloatParts p;
  FloatParts b_00;
  
  uVar9 = (ulong)a;
  bVar3 = s->float_exception_flags;
  if (((bVar3 & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      bVar12 = (a & 0x7f800000) == 0;
      bVar13 = (a & 0x7fffffff) != 0;
      if (bVar13 && bVar12) {
        uVar9 = (ulong)(a & 0x80000000);
        bVar3 = bVar3 | 0x40;
      }
      bVar14 = (b & 0x7f800000) == 0;
      bVar15 = (b & 0x7fffffff) != 0;
      if (bVar15 && bVar14) {
        b = b & 0x80000000;
        bVar3 = bVar3 | 0x40;
      }
      if (bVar13 && bVar12 || bVar15 && bVar14) {
        s->float_exception_flags = bVar3;
      }
    }
    if ((((uVar9 & 0x7fffffff) == 0) || (((int)(uVar9 >> 0x17) + 1U & 0xfe) != 0)) &&
       (((b >> 0x17) + 1 & 0xfe) != 0)) {
      fVar16 = (float)uVar9 / (float)b;
      if (ABS(fVar16) == INFINITY) {
        s->float_exception_flags = bVar3 | 8;
        return (float32)fVar16;
      }
      if ((1.1754944e-38 < ABS(fVar16)) || ((uVar9 & 0x7fffffff) == 0)) {
        return (float32)fVar16;
      }
    }
  }
  FVar17._8_8_ = (ulong)((uint)(uVar9 >> 0x17) & 0xff) | (ulong)((uint)uVar9 & 0x80000000) << 9;
  FVar17.frac = (ulong)((uint)uVar9 & 0x7fffff);
  FVar17 = sf_canonicalize(FVar17,&float32_params,s);
  uVar10 = FVar17._8_8_;
  uVar9 = FVar17.frac;
  FVar18._8_8_ = (ulong)(b >> 0x17 & 0xff) | (ulong)(b & 0x80000000) << 9;
  FVar18.frac = (ulong)(b & 0x7fffff);
  FVar18 = sf_canonicalize(FVar18,&float32_params,s);
  uVar5 = FVar18._8_8_;
  uVar11 = FVar18.frac;
  uVar8 = (uVar5 ^ uVar10) & 0x10000000000;
  uVar6 = FVar17._12_4_ & 0xff;
  uVar4 = FVar18._12_4_ & 0xff;
  if ((uVar6 == 2) && (uVar4 == 2)) {
    uVar5 = (ulong)((FVar17.exp - FVar18.exp) - (uint)(uVar9 < uVar11));
    lVar7 = 0;
    if (uVar11 <= uVar9) {
      lVar7 = uVar9 << 0x3f;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar11 * 2;
    auVar2._8_8_ = uVar9 >> (uVar11 <= uVar9);
    auVar2._0_8_ = lVar7;
    uVar9 = (ulong)(SUB168(auVar2 % auVar1,0) != 0) | SUB168(auVar2 / auVar1,0);
    uVar10 = uVar10 & 0xffff00ff00000000;
  }
  else {
    if (((uVar10 | uVar5) & 0xfc00000000) != 0) {
      b_00._8_8_ = uVar5 & 0xffffffffffff;
      b_00.frac = uVar11;
      p = pick_nan(FVar17,b_00,s);
      goto LAB_005e0cdf;
    }
    if (((uVar10 >> 0x20 & 1) != 0) && (uVar6 == uVar4)) {
      s->float_exception_flags = s->float_exception_flags | 1;
      p.exp = 0x7fffffff;
      p.cls = float_class_qnan;
      p.sign = false;
      p._14_2_ = 0;
      p.frac = 0x2000000000000000;
      goto LAB_005e0cdf;
    }
    if ((uVar10 >> 0x20 & 1) != 0) {
      uVar8 = uVar8 | uVar10 & 0xffff0003ffffffff;
      p.exp = (int)uVar8;
      p.cls = (char)(uVar8 >> 0x20);
      p.sign = (_Bool)(char)(uVar8 >> 0x28);
      p._14_2_ = (short)(uVar8 >> 0x30);
      p.frac = uVar9;
      goto LAB_005e0cdf;
    }
    if (uVar4 == 3) {
      uVar11 = uVar10 & 0xffff0000ffffffff | uVar8 | 0x100000000;
      p.exp = (int)uVar11;
      p.cls = (char)(uVar11 >> 0x20);
      p.sign = (_Bool)(char)(uVar11 >> 0x28);
      p._14_2_ = (short)(uVar11 >> 0x30);
      p.frac = uVar9;
      goto LAB_005e0cdf;
    }
    if (uVar4 != 1) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x702,(char *)0x0);
    }
    s->float_exception_flags = s->float_exception_flags | 4;
    uVar10 = uVar10 & 0xffff0000ffffffff;
    uVar5 = 0x300000000;
  }
  uVar8 = uVar5 | uVar10 | uVar8;
  p.exp = (int)uVar8;
  p.cls = (char)(uVar8 >> 0x20);
  p.sign = (_Bool)(char)(uVar8 >> 0x28);
  p._14_2_ = (short)(uVar8 >> 0x30);
  p.frac = uVar9;
LAB_005e0cdf:
  FVar17 = round_canonical(p,s,&float32_params);
  return (uint)FVar17.frac & 0x7fffff | (FVar17.exp & 0xffU) << 0x17 |
         (uint)(FVar17._8_8_ >> 9) & 0x80000000;
}

Assistant:

static inline bool can_use_fpu(const float_status *s)
{
    if (QEMU_NO_HARDFLOAT) {
        return false;
    }
    return likely(s->float_exception_flags & float_flag_inexact &&
                  s->float_rounding_mode == float_round_nearest_even);
}